

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<0,_7,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float scalar;
  Type in0;
  Matrix<float,_4,_2> local_88;
  MatrixCaseUtils local_64 [12];
  VecAccess<float,_4,_3> local_58;
  Matrix<float,_4,_2> local_40;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    tcu::Matrix<float,_4,_2>::Matrix(&local_88);
    local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_88.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_88.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_88.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    tcu::Matrix<float,_4,_2>::Matrix(&local_88,(float *)sr::(anonymous_namespace)::s_constInMat2x4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    scalar = (evalCtx->coords).m_data[0];
  }
  else {
    scalar = -0.2;
  }
  tcu::operator+(&local_40,&local_88,scalar);
  reduceToVec3(local_64,&local_40);
  local_58.m_vector = &evalCtx->color;
  local_58.m_index[0] = 0;
  local_58.m_index[1] = 1;
  local_58.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_58,(Vector<float,_3> *)local_64);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 + in1);
	}